

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O1

string * __thiscall
cmGlobalGenerator::FrameworkDescriptor::GetFullPath_abi_cxx11_
          (string *__return_storage_ptr__,FrameworkDescriptor *this)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_c0;
  undefined8 local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  undefined1 local_88 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_68;
  undefined8 local_50;
  undefined1 *local_48;
  undefined8 local_40;
  size_type local_38;
  pointer local_30;
  string *local_28;
  
  if ((this->Directory)._M_string_length == 0) {
    GetFullName_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    GetFullName_abi_cxx11_(&local_c0,this);
    local_68.first._M_str = (this->Directory)._M_dataplus._M_p;
    local_68.first._M_len = (this->Directory)._M_string_length;
    local_68.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_90 = local_88;
    local_a0 = 0;
    local_98 = 1;
    local_88[0] = 0x2f;
    local_50 = 1;
    local_40 = 0;
    local_38 = local_c0._M_string_length;
    local_30 = local_c0._M_dataplus._M_p;
    views._M_len = 3;
    views._M_array = &local_68;
    local_48 = local_90;
    local_28 = &local_c0;
    cmCatViews(__return_storage_ptr__,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetFullPath() const
    {
      return this->Directory.empty()
        ? this->GetFullName()
        : cmStrCat(this->Directory, '/', this->GetFullName());
    }